

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O2

void __thiscall t_cl_generator::init_generator(t_cl_generator *this)

{
  string *__rhs;
  ofstream_with_content_based_conditional_update *poVar1;
  ofstream_with_content_based_conditional_update *this_00;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  string f_asd_name;
  string f_vars_name;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string program_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&program_dir,this);
  iVar2 = mkdir(program_dir._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&program_dir);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_vars_name,this);
      std::__cxx11::string::string
                ((string *)&f_types_name,f_vars_name._M_dataplus._M_p,(allocator *)&f_asd_name);
      std::operator+(&program_dir,&f_types_name,": ");
      pcVar6 = strerror(*piVar3);
      std::operator+(pbVar5,&program_dir,pcVar6);
      __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_vars_name,this);
  std::operator+(&f_types_name,&f_vars_name,"/");
  __rhs = &(this->super_t_oop_generator).super_t_generator.program_name_;
  std::operator+(&program_dir,&f_types_name,__rhs);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&f_vars_name);
  iVar2 = mkdir(program_dir._M_dataplus._M_p,0x1ff);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&f_vars_name,program_dir._M_dataplus._M_p,(allocator *)&f_asd_name);
      std::operator+(&f_types_name,&f_vars_name,": ");
      pcVar6 = strerror(*piVar3);
      std::operator+(pbVar5,&f_types_name,pcVar6);
      __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  this->temporary_var = 0;
  std::operator+(&f_asd_name,&program_dir,"/");
  std::operator+(&f_vars_name,&f_asd_name,__rhs);
  std::operator+(&f_types_name,&f_vars_name,"-types.lisp");
  std::__cxx11::string::~string((string *)&f_vars_name);
  std::__cxx11::string::~string((string *)&f_asd_name);
  std::operator+(&local_a8,&program_dir,"/");
  std::operator+(&f_asd_name,&local_a8,__rhs);
  std::operator+(&f_vars_name,&f_asd_name,"-vars.lisp");
  std::__cxx11::string::~string((string *)&f_asd_name);
  std::__cxx11::string::~string((string *)&local_a8);
  poVar1 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (poVar1,(char *)&f_types_name,__oflag);
  cl_autogen_comment_abi_cxx11_(&f_asd_name,this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&f_asd_name);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&f_asd_name);
  this_00 = &this->f_vars_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&f_vars_name,__oflag_00);
  cl_autogen_comment_abi_cxx11_(&f_asd_name,this);
  poVar4 = std::operator<<((ostream *)this_00,(string *)&f_asd_name);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&f_asd_name);
  package_def(this,(ostream *)poVar1);
  package_in(this,(ostream *)poVar1);
  package_in(this,(ostream *)this_00);
  if (this->no_asd == false) {
    std::operator+(&local_68,&program_dir,"/");
    std::operator+(&local_48,&local_68,&this->system_prefix);
    std::operator+(&local_a8,&local_48,__rhs);
    std::operator+(&f_asd_name,&local_a8,".asd");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    poVar1 = &this->f_asd_;
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (poVar1,(char *)&f_asd_name,__oflag_01);
    cl_autogen_comment_abi_cxx11_(&local_a8,this);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_a8);
    asdf_def(this,(ostream *)poVar1);
    std::__cxx11::string::~string((string *)&f_asd_name);
  }
  std::__cxx11::string::~string((string *)&f_vars_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&program_dir);
  return;
}

Assistant:

void t_cl_generator::init_generator() {
  MKDIR(get_out_dir().c_str());
  string program_dir = get_out_dir() + "/" + program_name_;
  MKDIR(program_dir.c_str());

  temporary_var = 0;

  string f_types_name = program_dir + "/" + program_name_ + "-types.lisp";
  string f_vars_name = program_dir + "/" + program_name_ + "-vars.lisp";

  f_types_.open(f_types_name);
  f_types_ << cl_autogen_comment() << endl;
  f_vars_.open(f_vars_name);
  f_vars_ << cl_autogen_comment() << endl;

  package_def(f_types_);
  package_in(f_types_);
  package_in(f_vars_);

  if (!no_asd) {
    string f_asd_name = program_dir + "/" + system_prefix + program_name_ + ".asd";
    f_asd_.open(f_asd_name);
    f_asd_ << cl_autogen_comment() << endl;
    asdf_def(f_asd_);
  }
}